

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_rope_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c,int n_dims,int mode,
              int n_ctx_orig,float freq_base,float freq_scale,float ext_factor,float attn_factor,
              float beta_fast,float beta_slow,_Bool inplace)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  uint in_R9D;
  int32_t params [15];
  ggml_tensor *result;
  int sections [4];
  ggml_tensor *in_stack_ffffffffffffff48;
  ggml_tensor *params_00;
  ggml_tensor *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 local_58 [23];
  byte local_41;
  int local_24;
  ggml_tensor *local_20;
  ggml_tensor *local_18;
  ggml_tensor *local_10;
  
  local_41 = (byte)params[0] & 1;
  if ((in_R9D & 1) != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xde6
               ,"GGML_ASSERT(%s) failed",
               "(mode & 1) == 0 && \"mode & 1 == 1 is no longer supported\"");
  }
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  _Var1 = ggml_is_vector(in_RDX);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xde8
               ,"GGML_ASSERT(%s) failed","ggml_is_vector(b)");
  }
  if (local_18->type != GGML_TYPE_I32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xde9
               ,"GGML_ASSERT(%s) failed","b->type == GGML_TYPE_I32");
  }
  if (local_10->ne[2] != local_18->ne[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xdea
               ,"GGML_ASSERT(%s) failed","a->ne[2] == b->ne[0]");
  }
  if (local_20 != (ggml_tensor *)0x0) {
    if (local_20->type != GGML_TYPE_F32) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xded,"GGML_ASSERT(%s) failed","c->type == GGML_TYPE_F32");
    }
    in_stack_ffffffffffffff50 = (ggml_tensor *)local_20->ne[0];
    if ((long)in_stack_ffffffffffffff50 < (long)(local_24 / 2)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xdee,"GGML_ASSERT(%s) failed","c->ne[0] >= n_dims / 2");
    }
  }
  memset(local_58,0,0x10);
  if ((local_41 & 1) == 0) {
    pgVar2 = ggml_dup_tensor((ggml_context *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    pgVar2 = ggml_view_tensor((ggml_context *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              (ggml_tensor *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  params_00 = pgVar2;
  memset(&stack0xffffffffffffff58,0,0x3c);
  ggml_set_op_params(in_stack_ffffffffffffff50,params_00,0x14f469);
  pgVar2->op = GGML_OP_ROPE;
  pgVar2->src[0] = local_10;
  pgVar2->src[1] = local_18;
  pgVar2->src[2] = local_20;
  return pgVar2;
}

Assistant:

static struct ggml_tensor * ggml_rope_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c,
        int                   n_dims,
        int                   mode,
        int                   n_ctx_orig,
        float                 freq_base,
        float                 freq_scale,
        float                 ext_factor,
        float                 attn_factor,
        float                 beta_fast,
        float                 beta_slow,
        bool                  inplace) {
    GGML_ASSERT((mode & 1) == 0 && "mode & 1 == 1 is no longer supported");

    GGML_ASSERT(ggml_is_vector(b));
    GGML_ASSERT(b->type == GGML_TYPE_I32);
    GGML_ASSERT(a->ne[2] == b->ne[0]);

    if (c) {
        GGML_ASSERT(c->type == GGML_TYPE_F32);
        GGML_ASSERT(c->ne[0] >= n_dims / 2);
    }

    int sections[4] = {0, 0, 0, 0};

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    int32_t params[15] = { /*n_past*/ 0, n_dims, mode, /*n_ctx*/ 0, n_ctx_orig };
    memcpy(params +  5, &freq_base,    sizeof(float));
    memcpy(params +  6, &freq_scale,   sizeof(float));
    memcpy(params +  7, &ext_factor,   sizeof(float));
    memcpy(params +  8, &attn_factor,  sizeof(float));
    memcpy(params +  9, &beta_fast,    sizeof(float));
    memcpy(params + 10, &beta_slow,    sizeof(float));
    memcpy(params + 11, &sections,     sizeof(int)*4);
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_ROPE;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}